

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManEvaluateMapping(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Vec_Int_t *pVVar5;
  int Required;
  int Delay;
  int iAnd;
  int iLut;
  int i;
  Vec_Int_t *vFanins;
  abctime clk;
  int DelayGlo_local;
  Sbl_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  Delay = -1;
  if (p->pGia->vEdge1 == (Vec_Int_t *)0x0) {
    Vec_IntClear(p->vPath);
    Sbl_ManCreateTiming(p,DelayGlo);
    Sbl_ManGetCurrentMapping(p);
    for (iAnd = 0; iVar1 = Vec_IntSize(p->vAnds), iAnd < iVar1; iAnd = iAnd + 1) {
      Delay = Vec_IntEntry(p->vAnds,iAnd);
      pVVar5 = Vec_WecEntry(p->vWindow,iAnd);
      iVar1 = Sbl_ManComputeDelay(p,Delay,pVVar5);
      Vec_IntWriteEntry(p->vArrs,Delay,iVar1);
    }
    for (iAnd = 0; iVar1 = Vec_IntSize(p->vRoots), iAnd < iVar1; iAnd = iAnd + 1) {
      Delay = Vec_IntEntry(p->vRoots,iAnd);
      iVar1 = Vec_IntEntry(p->vArrs,Delay);
      iVar2 = Vec_IntEntry(p->vReqs,Delay);
      if (iVar2 < iVar1) break;
    }
    aVar4 = Abc_Clock();
    p->timeTime = (aVar4 - aVar3) + p->timeTime;
    iVar1 = Vec_IntSize(p->vRoots);
    if (iAnd == iVar1) {
      p_local._4_4_ = 1;
    }
    else {
      Required = Vec_IntFind(p->vAnds,Delay);
      if (Required < 0) {
        __assert_fail("iAnd >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                      ,499,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
      }
      iVar1 = Vec_IntEntry(p->vRootVars,iAnd);
      if (Required != iVar1) {
        __assert_fail("iAnd == Vec_IntEntry(p->vRootVars, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                      ,0x1f5,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
      }
      do {
        pVVar5 = p->vPath;
        iVar1 = Abc_Var2Lit(Required,1);
        Vec_IntPush(pVVar5,iVar1);
        pVVar5 = Vec_WecEntry(p->vWindow,Required);
        Delay = Sbl_ManCriticalFanin(p,Delay,pVVar5);
        if (Delay < 1) {
          __assert_fail("iLut > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                        ,0x1fd,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
        }
        Required = Vec_IntFind(p->vAnds,Delay);
      } while (Required != -1);
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = Sbl_ManEvaluateMappingEdge(p,DelayGlo);
  }
  return p_local._4_4_;
}

Assistant:

int Sbl_ManEvaluateMapping( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vFanins;
    int i, iLut = -1, iAnd, Delay, Required;
    if ( p->pGia->vEdge1 )
        return Sbl_ManEvaluateMappingEdge( p, DelayGlo );
    Vec_IntClear( p->vPath );
    // derive timing
    Sbl_ManCreateTiming( p, DelayGlo );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    Vec_IntForEachEntry( p->vAnds, iLut, i )
    {
        vFanins = Vec_WecEntry( p->vWindow, i );
        Delay   = Sbl_ManComputeDelay( p, iLut, vFanins );
        Vec_IntWriteEntry( p->vArrs, iLut, Delay );
    }
    // compare timing at the root nodes
    Vec_IntForEachEntry( p->vRoots, iLut, i )
    {
        Delay    = Vec_IntEntry( p->vArrs, iLut );
        Required = Vec_IntEntry( p->vReqs, iLut );
        if ( Delay > Required ) // updated timing exceeded original timing
            break;
    }
    p->timeTime += Abc_Clock() - clk;
    if ( i == Vec_IntSize(p->vRoots) )
        return 1;
    // derive the critical path

    // find SAT variable of the node whose GIA ID is "iLut"
    iAnd = Vec_IntFind( p->vAnds, iLut );
    assert( iAnd >= 0 );
    // critical path begins in node "iLut", which is i-th root of the window
    assert( iAnd == Vec_IntEntry(p->vRootVars, i) );
    while ( 1 )
    {
        Vec_IntPush( p->vPath, Abc_Var2Lit(iAnd, 1) );
        // find fanins of this node
        vFanins = Vec_WecEntry( p->vWindow, iAnd );
        // find critical fanin
        iLut = Sbl_ManCriticalFanin( p, iLut, vFanins );
        assert( iLut > 0  );
        // find SAT variable of the node whose GIA ID is "iLut"
        iAnd = Vec_IntFind( p->vAnds, iLut );
        if ( iAnd == -1 )
            break;
    }
    return 0;
}